

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9MemObjTryInteger(jx9_value *pObj)

{
  double dVar1;
  sxi32 in_EAX;
  long lVar2;
  
  if ((pObj->iFlags & 4) == 0) {
    return in_EAX;
  }
  dVar1 = (pObj->x).rVal;
  lVar2 = (long)dVar1;
  if (9.223372036854776e+18 < ABS(dVar1)) {
    lVar2 = -0x8000000000000000;
  }
  if (lVar2 + 0x7fffffffffffffffU < 0xfffffffffffffffe && (double)lVar2 == dVar1) {
    (pObj->x).iVal = lVar2;
    pObj->iFlags = 2;
  }
  return (sxi32)lVar2;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjTryInteger(jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_REAL ){
		/* Work only with reals */
		MemObjTryIntger(&(*pObj));
	}
	return SXRET_OK;
}